

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O3

Vec_Bit_t * Sbc_ManCriticalPath(Gia_Man_t *p)

{
  uint uVar1;
  int LevelFan;
  Vec_Bit_t *vPath;
  int *__s;
  Vec_Int_t *pVVar2;
  uint uVar3;
  int iVar4;
  size_t __size;
  long lVar5;
  int *pLevels;
  int *local_30;
  
  local_30 = (int *)0x0;
  if (p->pManTime == (void *)0x0) {
    LevelFan = Gia_ManLutLevel(p,&local_30);
  }
  else {
    LevelFan = Gia_ManLutLevelWithBoxes(p);
  }
  iVar4 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  vPath = (Vec_Bit_t *)malloc(0x10);
  vPath->nCap = iVar4 * 0x20;
  if (iVar4 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar4 << 2;
    __s = (int *)malloc(__size);
  }
  vPath->pArray = __s;
  vPath->nSize = iVar4 * 0x20;
  memset(__s,0,__size);
  if (p->pManTime != (void *)0x0) {
    local_30 = p->vLevels->pArray;
  }
  Gia_ManIncrementTravId(p);
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    lVar5 = 0;
    do {
      uVar1 = pVVar2->pArray[lVar5];
      if (((long)(int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar3 = *(uint *)(p->pObjs + (int)uVar1) & 0x1fffffff;
      iVar4 = uVar1 - uVar3;
      if ((local_30[iVar4] == LevelFan) && (uVar1 != uVar3)) {
        Sbc_ManCriticalPath_rec(p,local_30,iVar4,LevelFan,vPath,1);
        pVVar2 = p->vCos;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar2->nSize);
  }
  if (local_30 != (int *)0x0 && p->pManTime == (void *)0x0) {
    free(local_30);
    local_30 = (int *)0x0;
  }
  Sbc_ManAddInternalToPath(p,vPath);
  return vPath;
}

Assistant:

Vec_Bit_t * Sbc_ManCriticalPath( Gia_Man_t * p )
{
    int * pLevels = NULL, k, iDriver, Slack = 1;
    int nLevels = p->pManTime ? Gia_ManLutLevelWithBoxes(p) : Gia_ManLutLevel(p, &pLevels);
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    if ( p->pManTime )
        pLevels = Vec_IntArray( p->vLevels );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoDriverId( p, iDriver, k )
        if ( (pLevels[iDriver] == nLevels) && iDriver )
            Sbc_ManCriticalPath_rec( p, pLevels, iDriver, pLevels[iDriver], vPath, Slack );
    if ( !p->pManTime )
        ABC_FREE( pLevels );
    Sbc_ManAddInternalToPath( p, vPath );
    return vPath;
}